

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O3

int ffgsv(fitsfile *fptr,int datatype,long *blc,long *trc,long *inc,void *nulval,void *array,
         int *anynul,int *status)

{
  int iVar1;
  LONGLONG LVar2;
  long lVar3;
  float nulval_00;
  double nulval_01;
  uchar nulval_02;
  char nulval_03;
  unsigned_short nulval_04;
  short nulval_05;
  uint nulval_06;
  unsigned_long nulval_07;
  ULONGLONG nulval_08;
  int naxis;
  fitsfile *local_88;
  int local_7c;
  long naxes [9];
  
  if (0 < *status) {
    return *status;
  }
  local_7c = datatype;
  ffgidm(fptr,&naxis,status);
  ffgisz(fptr,9,naxes,status);
  local_88 = fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if ((long)naxis < 1) {
      lVar3 = 0;
      LVar2 = 1;
LAB_001401c4:
      if ((int)lVar3 != naxis) goto LAB_00140200;
    }
    else {
      LVar2 = 1;
      lVar3 = 0;
      do {
        if (((inc[lVar3] != 1) || (blc[lVar3] != 1)) || (trc[lVar3] != naxes[lVar3]))
        goto LAB_001401c4;
        LVar2 = LVar2 * trc[lVar3];
        lVar3 = lVar3 + 1;
      } while (naxis != lVar3);
    }
    ffgpxv(local_88,local_7c,blc,LVar2,nulval,array,anynul,status);
    goto LAB_001407d9;
  }
LAB_00140200:
  if (local_7c < 0x28) {
    if (local_7c < 0x15) {
      if (local_7c == 0xb) {
        if (nulval == (void *)0x0) {
          nulval_02 = '\0';
        }
        else {
          nulval_02 = *nulval;
        }
        ffgsvb(local_88,1,naxis,naxes,blc,trc,inc,nulval_02,(uchar *)array,anynul,status);
        goto LAB_001407d9;
      }
      if (local_7c == 0xc) {
        if (nulval == (void *)0x0) {
          nulval_03 = '\0';
        }
        else {
          nulval_03 = *nulval;
        }
        ffgsvsb(local_88,1,naxis,naxes,blc,trc,inc,nulval_03,(char *)array,anynul,status);
        goto LAB_001407d9;
      }
      if (local_7c == 0x14) {
        if (nulval == (void *)0x0) {
          nulval_04 = 0;
        }
        else {
          nulval_04 = *nulval;
        }
        ffgsvui(local_88,1,naxis,naxes,blc,trc,inc,nulval_04,(unsigned_short *)array,anynul,status);
        goto LAB_001407d9;
      }
    }
    else {
      if (local_7c == 0x15) {
        if (nulval == (void *)0x0) {
          nulval_05 = 0;
        }
        else {
          nulval_05 = *nulval;
        }
        ffgsvi(local_88,1,naxis,naxes,blc,trc,inc,nulval_05,(short *)array,anynul,status);
        goto LAB_001407d9;
      }
      if (local_7c == 0x1e) {
        if (nulval == (void *)0x0) {
          nulval_06 = 0;
        }
        else {
          nulval_06 = *nulval;
        }
        ffgsvuk(local_88,1,naxis,naxes,blc,trc,inc,nulval_06,(uint *)array,anynul,status);
        goto LAB_001407d9;
      }
      if (local_7c == 0x1f) {
        if (nulval == (void *)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = *nulval;
        }
        ffgsvk(local_88,1,naxis,naxes,blc,trc,inc,iVar1,(int *)array,anynul,status);
        goto LAB_001407d9;
      }
    }
  }
  else if (local_7c < 0x50) {
    if (local_7c == 0x28) {
      if (nulval == (void *)0x0) {
        nulval_07 = 0;
      }
      else {
        nulval_07 = *nulval;
      }
      ffgsvuj(local_88,1,naxis,naxes,blc,trc,inc,nulval_07,(unsigned_long *)array,anynul,status);
      goto LAB_001407d9;
    }
    if (local_7c == 0x29) {
      if (nulval == (void *)0x0) {
        lVar3 = 0;
      }
      else {
        lVar3 = *nulval;
      }
      ffgsvj(local_88,1,naxis,naxes,blc,trc,inc,lVar3,(long *)array,anynul,status);
      goto LAB_001407d9;
    }
    if (local_7c == 0x2a) {
      if (nulval == (void *)0x0) {
        nulval_00 = 0.0;
      }
      else {
        nulval_00 = *nulval;
      }
      ffgsve(local_88,1,naxis,naxes,blc,trc,inc,nulval_00,(float *)array,anynul,status);
      goto LAB_001407d9;
    }
  }
  else {
    if (local_7c == 0x50) {
      if (nulval == (void *)0x0) {
        nulval_08 = 0;
      }
      else {
        nulval_08 = *nulval;
      }
      ffgsvujj(local_88,1,naxis,naxes,blc,trc,inc,nulval_08,(ULONGLONG *)array,anynul,status);
      goto LAB_001407d9;
    }
    if (local_7c == 0x51) {
      if (nulval == (void *)0x0) {
        LVar2 = 0;
      }
      else {
        LVar2 = *nulval;
      }
      ffgsvjj(local_88,1,naxis,naxes,blc,trc,inc,LVar2,(LONGLONG *)array,anynul,status);
      goto LAB_001407d9;
    }
    if (local_7c == 0x52) {
      if (nulval == (void *)0x0) {
        nulval_01 = 0.0;
      }
      else {
        nulval_01 = *nulval;
      }
      ffgsvd(local_88,1,naxis,naxes,blc,trc,inc,nulval_01,(double *)array,anynul,status);
      goto LAB_001407d9;
    }
  }
  *status = 0x19a;
LAB_001407d9:
  return *status;
}

Assistant:

int ffgsv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *blc,        /* I - 'bottom left corner' of the subsection  */
            long *trc ,       /* I - 'top right corner' of the subsection    */
            long *inc,        /* I - increment to be applied in each dim.    */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an section of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    long naxes[9];
    LONGLONG nelem = 1;

    if (*status > 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, 9, naxes, status);

    /* test for the important special case where we are reading the whole image */
    /* this is only useful for images that are not tile-compressed */
    if (!fits_is_compressed_image(fptr, status)) {
        for (ii = 0; ii < naxis; ii++) {
            if (inc[ii] != 1 || blc[ii] !=1 || trc[ii] != naxes[ii])
                break;

            nelem = nelem * naxes[ii];
        }

        if (ii == naxis) {
            /* read the whole image more efficiently */
            ffgpxv(fptr, datatype, blc, nelem, nulval, array, anynul, status);
            return(*status);
        }
    }

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned char *) array, anynul, status);
      else
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned char *) nulval,
               (unsigned char *) array, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (signed char *) array, anynul, status);
      else
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, *(signed char *) nulval,
               (signed char *) array, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgsvui(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned short *) array, anynul, status);
      else
        ffgsvui(fptr, 1, naxis, naxes,blc, trc, inc, *(unsigned short *) nulval,
               (unsigned short *) array, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (short *) array, anynul, status);
      else
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, *(short *) nulval,
               (short *) array, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned int *) array, anynul, status);
      else
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned int *) nulval,
               (unsigned int *) array, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (int *) array, anynul, status);
      else
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, *(int *) nulval,
               (int *) array, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned long *) array, anynul, status);
      else
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned long *) nulval,
               (unsigned long *) array, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (long *) array, anynul, status);
      else
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, *(long *) nulval,
               (long *) array, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (ULONGLONG *) array, anynul, status);
      else
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (LONGLONG *) array, anynul, status);
      else
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, *(LONGLONG *) nulval,
               (LONGLONG *) array, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (float *) array, anynul, status);
      else
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, *(float *) nulval,
               (float *) array, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (double *) array, anynul, status);
      else
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, *(double *) nulval,
               (double *) array, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}